

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph.h
# Opt level: O0

uint32_t pgraph_offset_mask(chipset_info *chipset)

{
  chipset_info *chipset_local;
  
  if (chipset->chipset < 4) {
    chipset_local._4_4_ = 0x3ffff0;
    if (chipset->gpu == GPU_NV3T) {
      chipset_local._4_4_ = 0x7ffff0;
    }
  }
  else if (chipset->chipset < 5) {
    chipset_local._4_4_ = 0xfffff0;
  }
  else if (chipset->card_type < 0x10) {
    chipset_local._4_4_ = 0x1fffff0;
  }
  else if (chipset->card_type < 0x20) {
    chipset_local._4_4_ = 0x7fffff0;
  }
  else if (chipset->chipset == 0x34) {
    chipset_local._4_4_ = 0x3ffffff0;
  }
  else {
    chipset_local._4_4_ = 0x3fffffc0;
  }
  return chipset_local._4_4_;
}

Assistant:

static inline uint32_t pgraph_offset_mask(const struct chipset_info *chipset) {
	if (chipset->chipset < 4)
		return chipset->gpu == GPU_NV3T ? 0x007ffff0 : 0x003ffff0;
	if (chipset->chipset < 5)
		return 0x00fffff0;
	else if (chipset->card_type < 0x10)
		return 0x01fffff0;
	else if (chipset->card_type < 0x20)
		return 0x07fffff0;
	else if (chipset->chipset == 0x34)
		return 0x3ffffff0;
	else
		return 0x3fffffc0;
}